

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_DCP_ATMOS.cpp
# Opt level: O2

h__Reader * __thiscall
ASDCP::ATMOS::MXFReader::h__Reader::MD_to_DCData_DDesc(h__Reader *this,DCDataDescriptor *DDesc)

{
  long lVar1;
  undefined8 uVar2;
  undefined8 *in_RDX;
  undefined1 *puVar3;
  
  lVar1 = *(long *)(DDesc[0x24].DataEssenceCoding + 0xc);
  if (lVar1 == 0) {
    puVar3 = Kumu::RESULT_PTR;
  }
  else {
    *in_RDX = *(undefined8 *)(lVar1 + 0xf0);
    if (*(char *)(lVar1 + 0x100) == '\x01') {
      if (*(ulong *)(lVar1 + 0xf8) >> 0x20 != 0) {
        __assert_fail("DDescObj->ContainerDuration <= 0xFFFFFFFFL",
                      "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/AS_DCP_ATMOS.cpp"
                      ,0x8a,
                      "ASDCP::Result_t ASDCP::ATMOS::MXFReader::h__Reader::MD_to_DCData_DDesc(ASDCP::DCData::DCDataDescriptor &)"
                     );
      }
      *(int *)(in_RDX + 1) = (int)*(ulong *)(lVar1 + 0xf8);
    }
    uVar2 = *(undefined8 *)(lVar1 + 0x161);
    *(undefined8 *)((long)in_RDX + 0x1c) = *(undefined8 *)(lVar1 + 0x159);
    *(undefined8 *)((long)in_RDX + 0x24) = uVar2;
    puVar3 = Kumu::RESULT_OK;
  }
  Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)puVar3);
  return this;
}

Assistant:

ASDCP::Result_t
ASDCP::ATMOS::MXFReader::h__Reader::MD_to_DCData_DDesc(ASDCP::DCData::DCDataDescriptor& DDesc)
{
  ASDCP_TEST_NULL(m_EssenceDescriptor);
  MXF::PrivateDCDataDescriptor* DDescObj = m_EssenceDescriptor;
  DDesc.EditRate = DDescObj->SampleRate;
  if ( ! DDescObj->ContainerDuration.empty() )
    {
      assert(DDescObj->ContainerDuration <= 0xFFFFFFFFL);
      DDesc.ContainerDuration = static_cast<ui32_t>(DDescObj->ContainerDuration);
    }
  memcpy(DDesc.DataEssenceCoding, DDescObj->DataEssenceCoding.Value(), SMPTE_UL_LENGTH);
  return RESULT_OK;
}